

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void runcheckpropdata(runcxdef *ctx,objnum obj,prpnum prop)

{
  uchar uVar1;
  uint uVar2;
  undefined8 in_RAX;
  uchar *puVar3;
  undefined6 in_register_00000032;
  objnum target;
  mcmon local_12;
  
  local_12 = (mcmon)((ulong)in_RAX >> 0x30);
  if ((int)CONCAT62(in_register_00000032,obj) == 0xffff) {
    errsigf(ctx->runcxerr,"TADS",0x3f2);
  }
  uVar2 = objgetap(ctx->runcxmem,obj,prop,&local_12,0);
  if (uVar2 != 0) {
    puVar3 = mcmlck(ctx->runcxmem,local_12);
    uVar1 = puVar3[(ulong)uVar2 + 2];
    mcmunlck(ctx->runcxmem,local_12);
    if ((uVar1 == '\t') || (uVar1 == '\x06')) {
      errsigf(ctx->runcxerr,"TADS",0x7e4);
    }
  }
  return;
}

Assistant:

static void runcheckpropdata(runcxdef *ctx, objnum obj, prpnum prop)
{
    uint    pofs;
    objnum  target;
    objdef *objptr;
    prpdef *prpptr;
    int     typ;

    /* if the object is invalid, it's an error */
    if (obj == MCMONINV)
        errsig(ctx->runcxerr, ERR_REQVOB);
    
    /* get the property */
    pofs = objgetap(ctx->runcxmem, obj, prop, &target, FALSE);

    /* if there's no property, it's okay - it will just return nil */
    if (pofs == 0)
        return;

    /* get the object */
    objptr = mcmlck(ctx->runcxmem, target);

    /* get the property */
    prpptr = (prpdef *)(((uchar *)objptr) + pofs);
    typ = prptype(prpptr);

    /* we're done with the object's memory now */
    mcmunlck(ctx->runcxmem, target);

    /* check the type */
    switch(typ)
    {
    case DAT_CODE:
    case DAT_DSTRING:
        /* 
         *   we can't call code or evaluate (i.e., print) double-quoted
         *   strings during speculative evaluation 
         */
        errsig(ctx->runcxerr, ERR_RTBADSPECEXPR);

    default:
        /* other types do not involve method calls, so they're okay */
        break;
    }
}